

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDAAllocVectors(IDAMem IDA_mem,N_Vector tmpl)

{
  undefined8 uVar1;
  undefined8 in_RSI;
  long in_RDI;
  int maxcol;
  int j;
  int i;
  int local_28;
  int local_20;
  int local_1c;
  int local_4;
  
  uVar1 = N_VClone(in_RSI);
  *(undefined8 *)(in_RDI + 0x180) = uVar1;
  if (*(long *)(in_RDI + 0x180) == 0) {
    local_4 = 0;
  }
  else {
    uVar1 = N_VClone(in_RSI);
    *(undefined8 *)(in_RDI + 0x1c8) = uVar1;
    if (*(long *)(in_RDI + 0x1c8) == 0) {
      N_VDestroy(*(undefined8 *)(in_RDI + 0x180));
      local_4 = 0;
    }
    else {
      uVar1 = N_VClone(in_RSI);
      *(undefined8 *)(in_RDI + 0x1a8) = uVar1;
      if (*(long *)(in_RDI + 0x1a8) == 0) {
        N_VDestroy(*(undefined8 *)(in_RDI + 0x180));
        N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
        local_4 = 0;
      }
      else {
        uVar1 = N_VClone(in_RSI);
        *(undefined8 *)(in_RDI + 0x198) = uVar1;
        if (*(long *)(in_RDI + 0x198) == 0) {
          N_VDestroy(*(undefined8 *)(in_RDI + 0x180));
          N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
          N_VDestroy(*(undefined8 *)(in_RDI + 0x1a8));
          local_4 = 0;
        }
        else {
          uVar1 = N_VClone(in_RSI);
          *(undefined8 *)(in_RDI + 0x1a0) = uVar1;
          if (*(long *)(in_RDI + 0x1a0) == 0) {
            N_VDestroy(*(undefined8 *)(in_RDI + 0x180));
            N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
            N_VDestroy(*(undefined8 *)(in_RDI + 0x1a8));
            N_VDestroy(*(undefined8 *)(in_RDI + 0x198));
            local_4 = 0;
          }
          else {
            uVar1 = N_VClone(in_RSI);
            *(undefined8 *)(in_RDI + 0x1c0) = uVar1;
            if (*(long *)(in_RDI + 0x1c0) == 0) {
              N_VDestroy(*(undefined8 *)(in_RDI + 0x180));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x1a8));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x198));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x1a0));
              local_4 = 0;
            }
            else {
              uVar1 = N_VClone(in_RSI);
              *(undefined8 *)(in_RDI + 0x1d0) = uVar1;
              if (*(long *)(in_RDI + 0x1d0) == 0) {
                N_VDestroy(*(undefined8 *)(in_RDI + 0x180));
                N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
                N_VDestroy(*(undefined8 *)(in_RDI + 0x1a8));
                N_VDestroy(*(undefined8 *)(in_RDI + 0x198));
                N_VDestroy(*(undefined8 *)(in_RDI + 0x1a0));
                N_VDestroy(*(undefined8 *)(in_RDI + 0x1c0));
                local_4 = 0;
              }
              else {
                uVar1 = N_VClone(in_RSI);
                *(undefined8 *)(in_RDI + 0x1d8) = uVar1;
                if (*(long *)(in_RDI + 0x1d8) == 0) {
                  N_VDestroy(*(undefined8 *)(in_RDI + 0x180));
                  N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
                  N_VDestroy(*(undefined8 *)(in_RDI + 0x1a8));
                  N_VDestroy(*(undefined8 *)(in_RDI + 0x198));
                  N_VDestroy(*(undefined8 *)(in_RDI + 0x1a0));
                  N_VDestroy(*(undefined8 *)(in_RDI + 0x1c0));
                  N_VDestroy(*(undefined8 *)(in_RDI + 0x1d0));
                  local_4 = 0;
                }
                else {
                  uVar1 = N_VClone(in_RSI);
                  *(undefined8 *)(in_RDI + 0x1e0) = uVar1;
                  if (*(long *)(in_RDI + 0x1e0) == 0) {
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x180));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1a8));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x198));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1a0));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1c0));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1d0));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1d8));
                    local_4 = 0;
                  }
                  else {
                    if (*(int *)(in_RDI + 0x308) < 4) {
                      local_28 = 3;
                    }
                    else {
                      local_28 = *(int *)(in_RDI + 0x308);
                    }
                    for (local_20 = 0; local_20 <= local_28; local_20 = local_20 + 1) {
                      uVar1 = N_VClone(in_RSI);
                      *(undefined8 *)(in_RDI + 0x60 + (long)local_20 * 8) = uVar1;
                      if (*(long *)(in_RDI + 0x60 + (long)local_20 * 8) == 0) {
                        N_VDestroy(*(undefined8 *)(in_RDI + 0x180));
                        N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
                        N_VDestroy(*(undefined8 *)(in_RDI + 0x1a8));
                        N_VDestroy(*(undefined8 *)(in_RDI + 0x198));
                        N_VDestroy(*(undefined8 *)(in_RDI + 0x1a0));
                        N_VDestroy(*(undefined8 *)(in_RDI + 0x1c0));
                        N_VDestroy(*(undefined8 *)(in_RDI + 0x1d0));
                        N_VDestroy(*(undefined8 *)(in_RDI + 0x1d8));
                        N_VDestroy(*(undefined8 *)(in_RDI + 0x1e0));
                        for (local_1c = 0; local_1c < local_20; local_1c = local_1c + 1) {
                          N_VDestroy(*(undefined8 *)(in_RDI + 0x60 + (long)local_1c * 8));
                        }
                        return 0;
                      }
                    }
                    *(long *)(in_RDI + 0x3a8) =
                         (long)(local_28 + 10) * *(long *)(in_RDI + 0x398) +
                         *(long *)(in_RDI + 0x3a8);
                    *(long *)(in_RDI + 0x3b0) =
                         (long)(local_28 + 10) * *(long *)(in_RDI + 0x3a0) +
                         *(long *)(in_RDI + 0x3b0);
                    *(undefined4 *)(in_RDI + 0x30c) = *(undefined4 *)(in_RDI + 0x308);
                    local_4 = 1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static sunbooleantype IDAAllocVectors(IDAMem IDA_mem, N_Vector tmpl)
{
  int i, j, maxcol;

  /* Allocate ewt, ee, delta, yypredict, yppredict, savres, tempv1, tempv2, tempv3 */

  IDA_mem->ida_ewt = N_VClone(tmpl);
  if (IDA_mem->ida_ewt == NULL) { return (SUNFALSE); }

  IDA_mem->ida_ee = N_VClone(tmpl);
  if (IDA_mem->ida_ee == NULL)
  {
    N_VDestroy(IDA_mem->ida_ewt);
    return (SUNFALSE);
  }

  IDA_mem->ida_delta = N_VClone(tmpl);
  if (IDA_mem->ida_delta == NULL)
  {
    N_VDestroy(IDA_mem->ida_ewt);
    N_VDestroy(IDA_mem->ida_ee);
    return (SUNFALSE);
  }

  IDA_mem->ida_yypredict = N_VClone(tmpl);
  if (IDA_mem->ida_yypredict == NULL)
  {
    N_VDestroy(IDA_mem->ida_ewt);
    N_VDestroy(IDA_mem->ida_ee);
    N_VDestroy(IDA_mem->ida_delta);
    return (SUNFALSE);
  }

  IDA_mem->ida_yppredict = N_VClone(tmpl);
  if (IDA_mem->ida_yppredict == NULL)
  {
    N_VDestroy(IDA_mem->ida_ewt);
    N_VDestroy(IDA_mem->ida_ee);
    N_VDestroy(IDA_mem->ida_delta);
    N_VDestroy(IDA_mem->ida_yypredict);
    return (SUNFALSE);
  }

  IDA_mem->ida_savres = N_VClone(tmpl);
  if (IDA_mem->ida_savres == NULL)
  {
    N_VDestroy(IDA_mem->ida_ewt);
    N_VDestroy(IDA_mem->ida_ee);
    N_VDestroy(IDA_mem->ida_delta);
    N_VDestroy(IDA_mem->ida_yypredict);
    N_VDestroy(IDA_mem->ida_yppredict);
    return (SUNFALSE);
  }

  IDA_mem->ida_tempv1 = N_VClone(tmpl);
  if (IDA_mem->ida_tempv1 == NULL)
  {
    N_VDestroy(IDA_mem->ida_ewt);
    N_VDestroy(IDA_mem->ida_ee);
    N_VDestroy(IDA_mem->ida_delta);
    N_VDestroy(IDA_mem->ida_yypredict);
    N_VDestroy(IDA_mem->ida_yppredict);
    N_VDestroy(IDA_mem->ida_savres);
    return (SUNFALSE);
  }

  IDA_mem->ida_tempv2 = N_VClone(tmpl);
  if (IDA_mem->ida_tempv2 == NULL)
  {
    N_VDestroy(IDA_mem->ida_ewt);
    N_VDestroy(IDA_mem->ida_ee);
    N_VDestroy(IDA_mem->ida_delta);
    N_VDestroy(IDA_mem->ida_yypredict);
    N_VDestroy(IDA_mem->ida_yppredict);
    N_VDestroy(IDA_mem->ida_savres);
    N_VDestroy(IDA_mem->ida_tempv1);
    return (SUNFALSE);
  }

  IDA_mem->ida_tempv3 = N_VClone(tmpl);
  if (IDA_mem->ida_tempv3 == NULL)
  {
    N_VDestroy(IDA_mem->ida_ewt);
    N_VDestroy(IDA_mem->ida_ee);
    N_VDestroy(IDA_mem->ida_delta);
    N_VDestroy(IDA_mem->ida_yypredict);
    N_VDestroy(IDA_mem->ida_yppredict);
    N_VDestroy(IDA_mem->ida_savres);
    N_VDestroy(IDA_mem->ida_tempv1);
    N_VDestroy(IDA_mem->ida_tempv2);
    return (SUNFALSE);
  }

  /* Allocate phi[0] ... phi[maxord].  Make sure phi[2] and phi[3] are
  allocated (for use as temporary vectors), regardless of maxord.       */

  maxcol = SUNMAX(IDA_mem->ida_maxord, 3);
  for (j = 0; j <= maxcol; j++)
  {
    IDA_mem->ida_phi[j] = N_VClone(tmpl);
    if (IDA_mem->ida_phi[j] == NULL)
    {
      N_VDestroy(IDA_mem->ida_ewt);
      N_VDestroy(IDA_mem->ida_ee);
      N_VDestroy(IDA_mem->ida_delta);
      N_VDestroy(IDA_mem->ida_yypredict);
      N_VDestroy(IDA_mem->ida_yppredict);
      N_VDestroy(IDA_mem->ida_savres);
      N_VDestroy(IDA_mem->ida_tempv1);
      N_VDestroy(IDA_mem->ida_tempv2);
      N_VDestroy(IDA_mem->ida_tempv3);
      for (i = 0; i < j; i++) { N_VDestroy(IDA_mem->ida_phi[i]); }
      return (SUNFALSE);
    }
  }

  /* Update solver workspace lengths  */
  IDA_mem->ida_lrw += (maxcol + 10) * IDA_mem->ida_lrw1;
  IDA_mem->ida_liw += (maxcol + 10) * IDA_mem->ida_liw1;

  /* Store the value of maxord used here */
  IDA_mem->ida_maxord_alloc = IDA_mem->ida_maxord;

  return (SUNTRUE);
}